

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O0

void __thiscall
Js::MapOrSetDataList<void_*>::Remove(MapOrSetDataList<void_*> *this,MapOrSetDataNode<void_*> *node)

{
  code *pcVar1;
  bool bVar2;
  MapOrSetDataNode<void_*> **ppMVar3;
  MapOrSetDataNode<void_*> *pMVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_> local_28;
  Type prev;
  Type next;
  MapOrSetDataNode<void_*> *node_local;
  MapOrSetDataList<void_*> *this_local;
  
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierPtr(&prev,&node->next);
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierPtr(&local_28,&node->prev);
  ppMVar3 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__((WriteBarrierPtr *)&prev);
  if (*ppMVar3 == (MapOrSetDataNode<void_*> *)0x0) {
    ppMVar3 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                        ((WriteBarrierPtr *)&this->last);
    if (*ppMVar3 != node) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0xb2,"(last == node)","last == node");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this->last,&local_28);
  }
  else {
    pMVar4 = Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator->(&prev);
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&pMVar4->prev,&local_28);
  }
  ppMVar3 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                      ((WriteBarrierPtr *)&local_28);
  if (*ppMVar3 == (MapOrSetDataNode<void_*> *)0x0) {
    ppMVar3 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__((WriteBarrierPtr *)this);
    if (*ppMVar3 != node) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0xbc,"(first == node)","first == node");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this->first,&prev);
  }
  else {
    pMVar4 = Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator->(&local_28);
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&pMVar4->next,&prev);
  }
  return;
}

Assistant:

void Remove(MapOrSetDataNode<TData>* node)
        {
            // Cannot delete the node itself, nor change its next and prev pointers!
            // Otherwise active iterators may break. Iterators depend on nodes existing
            // until garbage collector picks them up.
            auto next = node->next;
            auto prev = node->prev;

            if (next)
            {
                next->prev = prev;
            }
            else
            {
                Assert(last == node);
                last = prev;
            }

            if (prev)
            {
                prev->next = next;
            }
            else
            {
                Assert(first == node);
                first = next;
            }
        }